

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.h
# Opt level: O3

char * __thiscall
btHingeConstraint::serialize(btHingeConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  int i_2;
  btTransform *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  btScalar bVar5;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  pbVar1 = &this->m_rbAFrame;
  lVar2 = (long)dataBuffer + 0x40;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(btScalar *)(lVar2 + lVar4 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0x70) = (this->m_rbAFrame).m_origin.m_floats[lVar2]
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pbVar1 = &this->m_rbBFrame;
  lVar2 = (long)dataBuffer + 0x80;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(btScalar *)(lVar2 + lVar4 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar2 * 4 + 0xb0) = (this->m_rbBFrame).m_origin.m_floats[lVar2]
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(uint *)((long)dataBuffer + 0xc4) = (uint)this->m_angularOnly;
  *(uint *)((long)dataBuffer + 200) = (uint)this->m_enableAngularMotor;
  *(undefined8 *)((long)dataBuffer + 0xcc) = *(undefined8 *)&this->m_motorTargetVelocity;
  *(uint *)((long)dataBuffer + 0xc0) = (uint)this->m_useReferenceFrameA;
  bVar5 = btAngularLimit::getLow(&this->m_limit);
  *(btScalar *)((long)dataBuffer + 0xd4) = bVar5;
  bVar5 = btAngularLimit::getHigh(&this->m_limit);
  *(btScalar *)((long)dataBuffer + 0xd8) = bVar5;
  *(undefined8 *)((long)dataBuffer + 0xdc) = *(undefined8 *)&(this->m_limit).m_softness;
  *(btScalar *)((long)dataBuffer + 0xe4) = (this->m_limit).m_relaxationFactor;
  return "btHingeConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btHingeConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btHingeConstraintData* hingeData = (btHingeConstraintData*)dataBuffer;
	btTypedConstraint::serialize(&hingeData->m_typeConstraintData,serializer);

	m_rbAFrame.serialize(hingeData->m_rbAFrame);
	m_rbBFrame.serialize(hingeData->m_rbBFrame);

	hingeData->m_angularOnly = m_angularOnly;
	hingeData->m_enableAngularMotor = m_enableAngularMotor;
	hingeData->m_maxMotorImpulse = float(m_maxMotorImpulse);
	hingeData->m_motorTargetVelocity = float(m_motorTargetVelocity);
	hingeData->m_useReferenceFrameA = m_useReferenceFrameA;
#ifdef	_BT_USE_CENTER_LIMIT_
	hingeData->m_lowerLimit = float(m_limit.getLow());
	hingeData->m_upperLimit = float(m_limit.getHigh());
	hingeData->m_limitSoftness = float(m_limit.getSoftness());
	hingeData->m_biasFactor = float(m_limit.getBiasFactor());
	hingeData->m_relaxationFactor = float(m_limit.getRelaxationFactor());
#else
	hingeData->m_lowerLimit = float(m_lowerLimit);
	hingeData->m_upperLimit = float(m_upperLimit);
	hingeData->m_limitSoftness = float(m_limitSoftness);
	hingeData->m_biasFactor = float(m_biasFactor);
	hingeData->m_relaxationFactor = float(m_relaxationFactor);
#endif

	return btHingeConstraintDataName;
}